

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenMemoryInit(BinaryenModuleRef module,char *segment,BinaryenExpressionRef dest,
                  BinaryenExpressionRef offset,BinaryenExpressionRef size,char *memoryName)

{
  MemoryInit *pMVar1;
  string_view local_60;
  IString local_50;
  Builder local_40;
  BinaryenExpressionRef local_38;
  
  local_40.wasm = module;
  local_38 = size;
  wasm::Name::Name((Name *)&local_60,segment);
  local_50.str = (string_view)getMemoryName(module,memoryName);
  pMVar1 = wasm::Builder::makeMemoryInit
                     (&local_40,(Name)local_60,dest,offset,local_38,(Name)local_50.str);
  return (BinaryenExpressionRef)pMVar1;
}

Assistant:

BinaryenExpressionRef BinaryenMemoryInit(BinaryenModuleRef module,
                                         const char* segment,
                                         BinaryenExpressionRef dest,
                                         BinaryenExpressionRef offset,
                                         BinaryenExpressionRef size,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeMemoryInit(Name(segment),
                      (Expression*)dest,
                      (Expression*)offset,
                      (Expression*)size,
                      getMemoryName(module, memoryName)));
}